

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexPlatform.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexCachedReader::release(PtexCachedReader *this)

{
  int32_t *piVar1;
  
  LOCK();
  piVar1 = &this->_refCount;
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    PtexReaderCache::logRecentlyUsed(this->_cache,this);
    return;
  }
  return;
}

Assistant:

PTEX_INLINE T AtomicSubtract(volatile T* target, T value)
{
    switch(sizeof(T)){
    case 4:
        return (T)ATOMIC_SUB32(target, value);
        break;
    case 8:
        return (T)ATOMIC_SUB64(target, value);
        break;
    default:
        assert(0=="Can only use 32 or 64 bit atomics");
        return *(T*)NULL;
    }
}